

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# card.c
# Opt level: O3

char * card_print(Card *card,_Bool showDownCard)

{
  if (cardPrintBufIndex == 0xff) {
    cardPrintBufIndex = '\0';
  }
  if (showDownCard || card->faceUp != false) {
    sprintf(cardPrintBufs[cardPrintBufIndex],"%3d%c",(ulong)card->rank,
            (ulong)(uint)(int)"cdhs"[card->suit]);
  }
  else {
    cardPrintBufs[cardPrintBufIndex][4] = '\0';
    builtin_strncpy(cardPrintBufs[cardPrintBufIndex],"BACK",4);
  }
  cardPrintBufIndex = cardPrintBufIndex + 1;
  return (char *)((ulong)cardPrintBufIndex * 5 + 0x10ee0b);
}

Assistant:

char * card_print(Card * card, bool showDownCard)
{
	if(cardPrintBufIndex>=255)
		cardPrintBufIndex = 0;

	if(!card->faceUp && !showDownCard)
		sprintf(cardPrintBufs[cardPrintBufIndex], "BACK");
	else
		sprintf(cardPrintBufs[cardPrintBufIndex], "%3d%c", card->rank, SUIT_CHAR[card->suit]);

	cardPrintBufIndex++;
	return cardPrintBufs[(cardPrintBufIndex-1)];
}